

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int param_1,char **param_2)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  char *n;
  char *pcVar5;
  Clunk engine;
  UCIAdapter adapter;
  char sbuf [16384];
  
  clunk::Clunk::Clunk(&engine);
  senjo::UCIAdapter::UCIAdapter(&adapter);
  bVar2 = senjo::UCIAdapter::Start(&adapter,&engine.super_ChessEngine);
  if (bVar2) {
    memset(sbuf,0,0x4000);
LAB_00136470:
    pcVar4 = fgets(sbuf,0x4000,_stdin);
    pcVar5 = sbuf;
    if (pcVar4 != (char *)0x0) {
      do {
        cVar1 = *pcVar5;
        if (cVar1 != ' ') {
          pcVar4 = sbuf;
          if (cVar1 == '\0') goto LAB_001364bc;
          if ((cVar1 == '\r') || (cVar1 == '\n')) goto LAB_001364b5;
          iVar3 = isspace((int)cVar1);
          if (iVar3 != 0) {
            *pcVar5 = ' ';
          }
        }
        pcVar5 = pcVar5 + 1;
      } while( true );
    }
    goto LAB_001364e1;
  }
  iVar3 = 1;
  senjo::Output::Output((Output *)sbuf,InfoPrefix);
  std::operator<<((ostream *)&std::cout,"Unable to start UCIAdapter");
  senjo::Output::~Output((Output *)sbuf);
LAB_00136517:
  senjo::UCIAdapter::~UCIAdapter(&adapter);
  clunk::Clunk::~Clunk(&engine);
  return iVar3;
LAB_001364b5:
  *pcVar5 = '\0';
LAB_001364bc:
  while ((*pcVar4 != '\0' && (iVar3 = isspace((int)*pcVar4), iVar3 != 0))) {
    pcVar4 = pcVar4 + 1;
  }
  bVar2 = senjo::UCIAdapter::DoCommand(&adapter,pcVar4);
  if (!bVar2) goto LAB_001364e1;
  goto LAB_00136470;
LAB_001364e1:
  iVar3 = 0;
  goto LAB_00136517;
}

Assistant:

int main(int /*argc*/, char** /*argv*/)
{
  Clunk engine;
  senjo::UCIAdapter adapter;

  if (!adapter.Start(engine)) {
    senjo::Output() << "Unable to start UCIAdapter";
    return 1;
  }

  char sbuf[16384];
  memset(sbuf, 0, sizeof(sbuf));

  while (fgets(sbuf, sizeof(sbuf), stdin)) {
    char* cmd = sbuf;
    senjo::NormalizeString(cmd);
    if (!adapter.DoCommand(cmd)) {
      break;
    }
  }

  return 0;
}